

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O3

void __thiscall TTD::SnapshotExtractor::SnapshotExtractor(SnapshotExtractor *this)

{
  MarkTable::MarkTable(&this->m_marks);
  (this->m_worklist).list.super_DListBase<Js::RecyclableObject_*,_RealCount>.
  super_DListNodeBase<Js::RecyclableObject_*>.next.base =
       (DListNodeBase<Js::RecyclableObject_*> *)&this->m_worklist;
  (this->m_worklist).list.super_DListBase<Js::RecyclableObject_*,_RealCount>.
  super_DListNodeBase<Js::RecyclableObject_*>.prev.base =
       (DListNodeBase<Js::RecyclableObject_*> *)&this->m_worklist;
  (this->m_worklist).list.super_DListBase<Js::RecyclableObject_*,_RealCount>.super_RealCount.count =
       0;
  (this->m_worklist).list.allocator = &Memory::HeapAllocator::Instance;
  (this->m_idToHandlerMap).m_h1Prime = 0;
  (this->m_idToHandlerMap).m_h2Prime = 0;
  (this->m_idToHandlerMap).m_capacity = 0;
  (this->m_idToHandlerMap).m_hashArray = (Entry *)0x0;
  (this->m_idToHandlerMap).m_count = 0;
  (this->m_idToTypeMap).m_h1Prime = 0;
  (this->m_idToTypeMap).m_h2Prime = 0;
  (this->m_idToTypeMap).m_capacity = 0;
  (this->m_idToTypeMap).m_hashArray = (Entry *)0x0;
  (this->m_idToTypeMap).m_count = 0;
  this->m_pendingSnap = (SnapShot *)0x0;
  this->m_snapshotsTakenCount = 0;
  this->m_totalMarkMillis = 0.0;
  this->m_totalExtractMillis = 0.0;
  this->m_maxMarkMillis = 0.0;
  this->m_maxExtractMillis = 0.0;
  this->m_lastMarkMillis = 0.0;
  this->m_lastExtractMillis = 0.0;
  return;
}

Assistant:

SnapshotExtractor::SnapshotExtractor()
        : m_marks(), m_worklist(&HeapAllocator::Instance),
        m_idToHandlerMap(), m_idToTypeMap(),
        m_pendingSnap(nullptr),
        m_snapshotsTakenCount(0),
        m_totalMarkMillis(0.0), m_totalExtractMillis(0.0),
        m_maxMarkMillis(0.0), m_maxExtractMillis(0.0),
        m_lastMarkMillis(0.0), m_lastExtractMillis(0.0)
    {
        ;
    }